

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase52::run(TestCase52 *this)

{
  bool bVar1;
  unsigned_short uVar2;
  uint uVar3;
  unsigned_long uVar4;
  bool local_150;
  bool local_14f;
  bool local_14e;
  bool local_14d;
  bool local_14c;
  bool local_14b;
  bool local_14a;
  bool local_149;
  bool _kj_shouldLog_41;
  bool _kj_shouldLog_40;
  bool _kj_shouldLog_39;
  bool _kj_shouldLog_38;
  bool _kj_shouldLog_37;
  bool _kj_shouldLog_36;
  bool _kj_shouldLog_35;
  bool _kj_shouldLog_34;
  bool _kj_shouldLog_33;
  bool _kj_shouldLog_32;
  bool _kj_shouldLog_31;
  bool _kj_shouldLog_30;
  bool _kj_shouldLog_29;
  bool _kj_shouldLog_28;
  bool _kj_shouldLog_27;
  bool _kj_shouldLog_26;
  bool _kj_shouldLog_25;
  bool _kj_shouldLog_24;
  bool _kj_shouldLog_23;
  bool _kj_shouldLog_22;
  bool _kj_shouldLog_21;
  bool _kj_shouldLog_20;
  bool _kj_shouldLog_19;
  bool _kj_shouldLog_18;
  bool _kj_shouldLog_17;
  bool _kj_shouldLog_16;
  bool local_12d;
  uint local_12c;
  uint uStack_128;
  bool _kj_shouldLog_15;
  bool local_121;
  unsigned_long uStack_120;
  bool _kj_shouldLog_14;
  uint local_114;
  bool local_10f;
  unsigned_short local_10e;
  uint local_10c;
  bool _kj_shouldLog_13;
  bool local_105;
  uint local_104;
  uint uStack_100;
  bool _kj_shouldLog_12;
  bool local_f9;
  unsigned_long uStack_f8;
  bool _kj_shouldLog_11;
  unsigned_long_long local_f0;
  bool local_e7;
  unsigned_short local_e6;
  uint local_e4;
  bool _kj_shouldLog_10;
  unsigned_short local_de;
  uint local_dc;
  bool _kj_shouldLog_9;
  unsigned_short local_d6;
  uint local_d4;
  bool _kj_shouldLog_8;
  unsigned_short local_ce;
  uint local_cc;
  bool _kj_shouldLog_7;
  unsigned_short local_c6;
  uint local_c4;
  bool _kj_shouldLog_6;
  bool local_bd;
  uint local_bc;
  uint uStack_b8;
  bool _kj_shouldLog_5;
  bool local_b1;
  uint local_b0;
  uint uStack_ac;
  bool _kj_shouldLog_4;
  bool local_a5;
  uint local_a4;
  uint uStack_a0;
  bool _kj_shouldLog_3;
  bool local_99;
  unsigned_long uStack_98;
  bool _kj_shouldLog_2;
  uint local_90;
  bool local_89;
  unsigned_long uStack_88;
  bool _kj_shouldLog_1;
  unsigned_long_long local_80;
  bool local_71;
  undefined1 local_70 [7];
  bool _kj_shouldLog;
  undefined1 local_50 [8];
  StructReader reader;
  AlignedData<2> data;
  TestCase52 *this_local;
  
  reader.nestingLimit = 0;
  reader._44_4_ = 1;
  PointerReader::getRootUnchecked((PointerReader *)local_70,(word *)&reader.nestingLimit);
  PointerReader::getStruct((StructReader *)local_50,(PointerReader *)local_70,(word *)0x0);
  uVar4 = StructReader::getDataField<unsigned_long>((StructReader *)local_50,0);
  if (uVar4 != 0xefcdab8967452301) {
    local_71 = kj::_::Debug::shouldLog(ERROR);
    while (local_71 != false) {
      local_80 = 0xefcdab8967452301;
      uStack_88 = StructReader::getDataField<unsigned_long>((StructReader *)local_50,0);
      kj::_::Debug::log<char_const(&)[90],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x3e,ERROR,
                 "\"failed: expected \" \"(0xefcdab8967452301ull) == (reader.getDataField<uint64_t>(0 * ELEMENTS))\", 0xefcdab8967452301ull, reader.getDataField<uint64_t>(0 * ELEMENTS)"
                 ,(char (*) [90])
                  "failed: expected (0xefcdab8967452301ull) == (reader.getDataField<uint64_t>(0 * ELEMENTS))"
                 ,&local_80,&stack0xffffffffffffff78);
      local_71 = false;
    }
  }
  uVar4 = StructReader::getDataField<unsigned_long>((StructReader *)local_50,1);
  if (uVar4 != 0) {
    local_89 = kj::_::Debug::shouldLog(ERROR);
    while (local_89 != false) {
      local_90 = 0;
      uStack_98 = StructReader::getDataField<unsigned_long>((StructReader *)local_50,1);
      kj::_::Debug::log<char_const(&)[71],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x3f,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getDataField<uint64_t>(1 * ELEMENTS))\", 0u, reader.getDataField<uint64_t>(1 * ELEMENTS)"
                 ,(char (*) [71])
                  "failed: expected (0u) == (reader.getDataField<uint64_t>(1 * ELEMENTS))",&local_90
                 ,&stack0xffffffffffffff68);
      local_89 = false;
    }
  }
  uVar3 = StructReader::getDataField<unsigned_int>((StructReader *)local_50,0);
  if (uVar3 != 0x67452301) {
    local_99 = kj::_::Debug::shouldLog(ERROR);
    while (local_99 != false) {
      uStack_a0 = 0x67452301;
      local_a4 = StructReader::getDataField<unsigned_int>((StructReader *)local_50,0);
      kj::_::Debug::log<char_const(&)[80],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x40,ERROR,
                 "\"failed: expected \" \"(0x67452301u) == (reader.getDataField<uint32_t>(0 * ELEMENTS))\", 0x67452301u, reader.getDataField<uint32_t>(0 * ELEMENTS)"
                 ,(char (*) [80])
                  "failed: expected (0x67452301u) == (reader.getDataField<uint32_t>(0 * ELEMENTS))",
                 &stack0xffffffffffffff60,&local_a4);
      local_99 = false;
    }
  }
  uVar3 = StructReader::getDataField<unsigned_int>((StructReader *)local_50,1);
  if (uVar3 != 0xefcdab89) {
    local_a5 = kj::_::Debug::shouldLog(ERROR);
    while (local_a5 != false) {
      uStack_ac = 0xefcdab89;
      local_b0 = StructReader::getDataField<unsigned_int>((StructReader *)local_50,1);
      kj::_::Debug::log<char_const(&)[80],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x41,ERROR,
                 "\"failed: expected \" \"(0xefcdab89u) == (reader.getDataField<uint32_t>(1 * ELEMENTS))\", 0xefcdab89u, reader.getDataField<uint32_t>(1 * ELEMENTS)"
                 ,(char (*) [80])
                  "failed: expected (0xefcdab89u) == (reader.getDataField<uint32_t>(1 * ELEMENTS))",
                 &stack0xffffffffffffff54,&local_b0);
      local_a5 = false;
    }
  }
  uVar3 = StructReader::getDataField<unsigned_int>((StructReader *)local_50,2);
  if (uVar3 != 0) {
    local_b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_b1 != false) {
      uStack_b8 = 0;
      local_bc = StructReader::getDataField<unsigned_int>((StructReader *)local_50,2);
      kj::_::Debug::log<char_const(&)[71],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x42,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getDataField<uint32_t>(2 * ELEMENTS))\", 0u, reader.getDataField<uint32_t>(2 * ELEMENTS)"
                 ,(char (*) [71])
                  "failed: expected (0u) == (reader.getDataField<uint32_t>(2 * ELEMENTS))",
                 &stack0xffffffffffffff48,&local_bc);
      local_b1 = false;
    }
  }
  uVar2 = StructReader::getDataField<unsigned_short>((StructReader *)local_50,0);
  if (uVar2 != 0x2301) {
    local_bd = kj::_::Debug::shouldLog(ERROR);
    while (local_bd != false) {
      local_c4 = 0x2301;
      local_c6 = StructReader::getDataField<unsigned_short>((StructReader *)local_50,0);
      kj::_::Debug::log<char_const(&)[76],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x43,ERROR,
                 "\"failed: expected \" \"(0x2301u) == (reader.getDataField<uint16_t>(0 * ELEMENTS))\", 0x2301u, reader.getDataField<uint16_t>(0 * ELEMENTS)"
                 ,(char (*) [76])
                  "failed: expected (0x2301u) == (reader.getDataField<uint16_t>(0 * ELEMENTS))",
                 &local_c4,&local_c6);
      local_bd = false;
    }
  }
  uVar2 = StructReader::getDataField<unsigned_short>((StructReader *)local_50,1);
  if (uVar2 != 0x6745) {
    _kj_shouldLog_7 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_7 != false) {
      local_cc = 0x6745;
      local_ce = StructReader::getDataField<unsigned_short>((StructReader *)local_50,1);
      kj::_::Debug::log<char_const(&)[76],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x44,ERROR,
                 "\"failed: expected \" \"(0x6745u) == (reader.getDataField<uint16_t>(1 * ELEMENTS))\", 0x6745u, reader.getDataField<uint16_t>(1 * ELEMENTS)"
                 ,(char (*) [76])
                  "failed: expected (0x6745u) == (reader.getDataField<uint16_t>(1 * ELEMENTS))",
                 &local_cc,&local_ce);
      _kj_shouldLog_7 = false;
    }
  }
  uVar2 = StructReader::getDataField<unsigned_short>((StructReader *)local_50,2);
  if (uVar2 != 0xab89) {
    _kj_shouldLog_8 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_8 != false) {
      local_d4 = 0xab89;
      local_d6 = StructReader::getDataField<unsigned_short>((StructReader *)local_50,2);
      kj::_::Debug::log<char_const(&)[76],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x45,ERROR,
                 "\"failed: expected \" \"(0xab89u) == (reader.getDataField<uint16_t>(2 * ELEMENTS))\", 0xab89u, reader.getDataField<uint16_t>(2 * ELEMENTS)"
                 ,(char (*) [76])
                  "failed: expected (0xab89u) == (reader.getDataField<uint16_t>(2 * ELEMENTS))",
                 &local_d4,&local_d6);
      _kj_shouldLog_8 = false;
    }
  }
  uVar2 = StructReader::getDataField<unsigned_short>((StructReader *)local_50,3);
  if (uVar2 != 0xefcd) {
    _kj_shouldLog_9 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_9 != false) {
      local_dc = 0xefcd;
      local_de = StructReader::getDataField<unsigned_short>((StructReader *)local_50,3);
      kj::_::Debug::log<char_const(&)[76],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x46,ERROR,
                 "\"failed: expected \" \"(0xefcdu) == (reader.getDataField<uint16_t>(3 * ELEMENTS))\", 0xefcdu, reader.getDataField<uint16_t>(3 * ELEMENTS)"
                 ,(char (*) [76])
                  "failed: expected (0xefcdu) == (reader.getDataField<uint16_t>(3 * ELEMENTS))",
                 &local_dc,&local_de);
      _kj_shouldLog_9 = false;
    }
  }
  uVar2 = StructReader::getDataField<unsigned_short>((StructReader *)local_50,4);
  if (uVar2 != 0) {
    _kj_shouldLog_10 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_10 != false) {
      local_e4 = 0;
      local_e6 = StructReader::getDataField<unsigned_short>((StructReader *)local_50,4);
      kj::_::Debug::log<char_const(&)[71],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x47,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getDataField<uint16_t>(4 * ELEMENTS))\", 0u, reader.getDataField<uint16_t>(4 * ELEMENTS)"
                 ,(char (*) [71])
                  "failed: expected (0u) == (reader.getDataField<uint16_t>(4 * ELEMENTS))",&local_e4
                 ,&local_e6);
      _kj_shouldLog_10 = false;
    }
  }
  uVar4 = StructReader::getDataField<unsigned_long>((StructReader *)local_50,0,0x141);
  if (uVar4 != 0xefcdab8967452240) {
    local_e7 = kj::_::Debug::shouldLog(ERROR);
    while (local_e7 != false) {
      local_f0 = 0xefcdab8967452240;
      uStack_f8 = StructReader::getDataField<unsigned_long>((StructReader *)local_50,0,0x141);
      kj::_::Debug::log<char_const(&)[103],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x49,ERROR,
                 "\"failed: expected \" \"(321u ^ 0xefcdab8967452301ull) == (reader.getDataField<uint64_t>(0 * ELEMENTS, 321u))\", 321u ^ 0xefcdab8967452301ull, reader.getDataField<uint64_t>(0 * ELEMENTS, 321u)"
                 ,(char (*) [103])
                  "failed: expected (321u ^ 0xefcdab8967452301ull) == (reader.getDataField<uint64_t>(0 * ELEMENTS, 321u))"
                 ,&local_f0,&stack0xffffffffffffff08);
      local_e7 = false;
    }
  }
  uVar3 = StructReader::getDataField<unsigned_int>((StructReader *)local_50,0,0x141);
  if (uVar3 != 0x67452240) {
    local_f9 = kj::_::Debug::shouldLog(ERROR);
    while (local_f9 != false) {
      uStack_100 = 0x67452240;
      local_104 = StructReader::getDataField<unsigned_int>((StructReader *)local_50,0,0x141);
      kj::_::Debug::log<char_const(&)[93],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x4a,ERROR,
                 "\"failed: expected \" \"(321u ^ 0x67452301u) == (reader.getDataField<uint32_t>(0 * ELEMENTS, 321u))\", 321u ^ 0x67452301u, reader.getDataField<uint32_t>(0 * ELEMENTS, 321u)"
                 ,(char (*) [93])
                  "failed: expected (321u ^ 0x67452301u) == (reader.getDataField<uint32_t>(0 * ELEMENTS, 321u))"
                 ,&stack0xffffffffffffff00,&local_104);
      local_f9 = false;
    }
  }
  uVar2 = StructReader::getDataField<unsigned_short>((StructReader *)local_50,0,0x141);
  if (uVar2 != 0x2240) {
    local_105 = kj::_::Debug::shouldLog(ERROR);
    while (local_105 != false) {
      local_10c = 0x2240;
      local_10e = StructReader::getDataField<unsigned_short>((StructReader *)local_50,0,0x141);
      kj::_::Debug::log<char_const(&)[89],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x4b,ERROR,
                 "\"failed: expected \" \"(321u ^ 0x2301u) == (reader.getDataField<uint16_t>(0 * ELEMENTS, 321u))\", 321u ^ 0x2301u, reader.getDataField<uint16_t>(0 * ELEMENTS, 321u)"
                 ,(char (*) [89])
                  "failed: expected (321u ^ 0x2301u) == (reader.getDataField<uint16_t>(0 * ELEMENTS, 321u))"
                 ,&local_10c,&local_10e);
      local_105 = false;
    }
  }
  uVar4 = StructReader::getDataField<unsigned_long>((StructReader *)local_50,1,0x141);
  if (uVar4 != 0x141) {
    local_10f = kj::_::Debug::shouldLog(ERROR);
    while (local_10f != false) {
      local_114 = 0x141;
      uStack_120 = StructReader::getDataField<unsigned_long>((StructReader *)local_50,1,0x141);
      kj::_::Debug::log<char_const(&)[79],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x4c,ERROR,
                 "\"failed: expected \" \"(321u) == (reader.getDataField<uint64_t>(1 * ELEMENTS, 321u))\", 321u, reader.getDataField<uint64_t>(1 * ELEMENTS, 321u)"
                 ,(char (*) [79])
                  "failed: expected (321u) == (reader.getDataField<uint64_t>(1 * ELEMENTS, 321u))",
                 &local_114,&stack0xfffffffffffffee0);
      local_10f = false;
    }
  }
  uVar3 = StructReader::getDataField<unsigned_int>((StructReader *)local_50,2,0x141);
  if (uVar3 != 0x141) {
    local_121 = kj::_::Debug::shouldLog(ERROR);
    while (local_121 != false) {
      uStack_128 = 0x141;
      local_12c = StructReader::getDataField<unsigned_int>((StructReader *)local_50,2,0x141);
      kj::_::Debug::log<char_const(&)[79],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x4d,ERROR,
                 "\"failed: expected \" \"(321u) == (reader.getDataField<uint32_t>(2 * ELEMENTS, 321u))\", 321u, reader.getDataField<uint32_t>(2 * ELEMENTS, 321u)"
                 ,(char (*) [79])
                  "failed: expected (321u) == (reader.getDataField<uint32_t>(2 * ELEMENTS, 321u))",
                 &stack0xfffffffffffffed8,&local_12c);
      local_121 = false;
    }
  }
  uVar2 = StructReader::getDataField<unsigned_short>((StructReader *)local_50,4,0x141);
  if (uVar2 != 0x141) {
    local_12d = kj::_::Debug::shouldLog(ERROR);
    while (local_12d != false) {
      __kj_shouldLog_21 = 0x141;
      __kj_shouldLog_23 =
           StructReader::getDataField<unsigned_short>((StructReader *)local_50,4,0x141);
      kj::_::Debug::log<char_const(&)[79],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x4e,ERROR,
                 "\"failed: expected \" \"(321u) == (reader.getDataField<uint16_t>(4 * ELEMENTS, 321u))\", 321u, reader.getDataField<uint16_t>(4 * ELEMENTS, 321u)"
                 ,(char (*) [79])
                  "failed: expected (321u) == (reader.getDataField<uint16_t>(4 * ELEMENTS, 321u))",
                 (uint *)&_kj_shouldLog_21,(unsigned_short *)&_kj_shouldLog_23);
      local_12d = false;
    }
  }
  bVar1 = StructReader::getDataField<bool>((StructReader *)local_50,0);
  if (!bVar1) {
    _kj_shouldLog_24 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_24 != false) {
      kj::_::Debug::log<char_const(&)[57]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x51,ERROR,"\"failed: expected \" \"reader.getDataField<bool>(0 * ELEMENTS)\"",
                 (char (*) [57])"failed: expected reader.getDataField<bool>(0 * ELEMENTS)");
      _kj_shouldLog_24 = false;
    }
  }
  bVar1 = StructReader::getDataField<bool>((StructReader *)local_50,1);
  if (bVar1) {
    _kj_shouldLog_25 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_25 != false) {
      kj::_::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x52,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(1 * ELEMENTS))\"",
                 (char (*) [60])"failed: expected !(reader.getDataField<bool>(1 * ELEMENTS))");
      _kj_shouldLog_25 = false;
    }
  }
  bVar1 = StructReader::getDataField<bool>((StructReader *)local_50,2);
  if (bVar1) {
    _kj_shouldLog_26 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_26 != false) {
      kj::_::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x53,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(2 * ELEMENTS))\"",
                 (char (*) [60])"failed: expected !(reader.getDataField<bool>(2 * ELEMENTS))");
      _kj_shouldLog_26 = false;
    }
  }
  bVar1 = StructReader::getDataField<bool>((StructReader *)local_50,3);
  if (bVar1) {
    _kj_shouldLog_27 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_27 != false) {
      kj::_::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x54,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(3 * ELEMENTS))\"",
                 (char (*) [60])"failed: expected !(reader.getDataField<bool>(3 * ELEMENTS))");
      _kj_shouldLog_27 = false;
    }
  }
  bVar1 = StructReader::getDataField<bool>((StructReader *)local_50,4);
  if (bVar1) {
    _kj_shouldLog_28 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_28 != false) {
      kj::_::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x55,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(4 * ELEMENTS))\"",
                 (char (*) [60])"failed: expected !(reader.getDataField<bool>(4 * ELEMENTS))");
      _kj_shouldLog_28 = false;
    }
  }
  bVar1 = StructReader::getDataField<bool>((StructReader *)local_50,5);
  if (bVar1) {
    _kj_shouldLog_29 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_29 != false) {
      kj::_::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x56,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(5 * ELEMENTS))\"",
                 (char (*) [60])"failed: expected !(reader.getDataField<bool>(5 * ELEMENTS))");
      _kj_shouldLog_29 = false;
    }
  }
  bVar1 = StructReader::getDataField<bool>((StructReader *)local_50,6);
  if (bVar1) {
    _kj_shouldLog_30 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_30 != false) {
      kj::_::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x57,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(6 * ELEMENTS))\"",
                 (char (*) [60])"failed: expected !(reader.getDataField<bool>(6 * ELEMENTS))");
      _kj_shouldLog_30 = false;
    }
  }
  bVar1 = StructReader::getDataField<bool>((StructReader *)local_50,7);
  if (bVar1) {
    _kj_shouldLog_31 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_31 != false) {
      kj::_::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x58,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(7 * ELEMENTS))\"",
                 (char (*) [60])"failed: expected !(reader.getDataField<bool>(7 * ELEMENTS))");
      _kj_shouldLog_31 = false;
    }
  }
  bVar1 = StructReader::getDataField<bool>((StructReader *)local_50,8);
  if (!bVar1) {
    _kj_shouldLog_32 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_32 != false) {
      kj::_::Debug::log<char_const(&)[58]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x5a,ERROR,"\"failed: expected \" \"reader.getDataField<bool>( 8 * ELEMENTS)\"",
                 (char (*) [58])"failed: expected reader.getDataField<bool>( 8 * ELEMENTS)");
      _kj_shouldLog_32 = false;
    }
  }
  bVar1 = StructReader::getDataField<bool>((StructReader *)local_50,9);
  if (!bVar1) {
    _kj_shouldLog_33 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_33 != false) {
      kj::_::Debug::log<char_const(&)[58]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x5b,ERROR,"\"failed: expected \" \"reader.getDataField<bool>( 9 * ELEMENTS)\"",
                 (char (*) [58])"failed: expected reader.getDataField<bool>( 9 * ELEMENTS)");
      _kj_shouldLog_33 = false;
    }
  }
  bVar1 = StructReader::getDataField<bool>((StructReader *)local_50,10);
  if (bVar1) {
    _kj_shouldLog_34 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_34 != false) {
      kj::_::Debug::log<char_const(&)[61]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x5c,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(10 * ELEMENTS))\""
                 ,(char (*) [61])"failed: expected !(reader.getDataField<bool>(10 * ELEMENTS))");
      _kj_shouldLog_34 = false;
    }
  }
  bVar1 = StructReader::getDataField<bool>((StructReader *)local_50,0xb);
  if (bVar1) {
    _kj_shouldLog_35 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_35 != false) {
      kj::_::Debug::log<char_const(&)[61]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x5d,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(11 * ELEMENTS))\""
                 ,(char (*) [61])"failed: expected !(reader.getDataField<bool>(11 * ELEMENTS))");
      _kj_shouldLog_35 = false;
    }
  }
  bVar1 = StructReader::getDataField<bool>((StructReader *)local_50,0xc);
  if (bVar1) {
    _kj_shouldLog_36 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_36 != false) {
      kj::_::Debug::log<char_const(&)[61]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x5e,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(12 * ELEMENTS))\""
                 ,(char (*) [61])"failed: expected !(reader.getDataField<bool>(12 * ELEMENTS))");
      _kj_shouldLog_36 = false;
    }
  }
  bVar1 = StructReader::getDataField<bool>((StructReader *)local_50,0xd);
  if (!bVar1) {
    _kj_shouldLog_37 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_37 != false) {
      kj::_::Debug::log<char_const(&)[58]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x5f,ERROR,"\"failed: expected \" \"reader.getDataField<bool>(13 * ELEMENTS)\"",
                 (char (*) [58])"failed: expected reader.getDataField<bool>(13 * ELEMENTS)");
      _kj_shouldLog_37 = false;
    }
  }
  bVar1 = StructReader::getDataField<bool>((StructReader *)local_50,0xe);
  if (bVar1) {
    _kj_shouldLog_38 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_38 != false) {
      kj::_::Debug::log<char_const(&)[61]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x60,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(14 * ELEMENTS))\""
                 ,(char (*) [61])"failed: expected !(reader.getDataField<bool>(14 * ELEMENTS))");
      _kj_shouldLog_38 = false;
    }
  }
  bVar1 = StructReader::getDataField<bool>((StructReader *)local_50,0xf);
  if (bVar1) {
    _kj_shouldLog_39 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_39 != false) {
      kj::_::Debug::log<char_const(&)[61]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x61,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(15 * ELEMENTS))\""
                 ,(char (*) [61])"failed: expected !(reader.getDataField<bool>(15 * ELEMENTS))");
      _kj_shouldLog_39 = false;
    }
  }
  bVar1 = StructReader::getDataField<bool>((StructReader *)local_50,0x3f);
  if (!bVar1) {
    _kj_shouldLog_40 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_40 != false) {
      kj::_::Debug::log<char_const(&)[58]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,99,ERROR,"\"failed: expected \" \"reader.getDataField<bool>(63 * ELEMENTS)\"",
                 (char (*) [58])"failed: expected reader.getDataField<bool>(63 * ELEMENTS)");
      _kj_shouldLog_40 = false;
    }
  }
  bVar1 = StructReader::getDataField<bool>((StructReader *)local_50,0x40);
  if (bVar1) {
    _kj_shouldLog_41 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_41 != false) {
      kj::_::Debug::log<char_const(&)[61]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,100,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(64 * ELEMENTS))\"",
                 (char (*) [61])"failed: expected !(reader.getDataField<bool>(64 * ELEMENTS))");
      _kj_shouldLog_41 = false;
    }
  }
  bVar1 = StructReader::getDataField<bool>((StructReader *)local_50,0,false);
  if (!bVar1) {
    local_149 = kj::_::Debug::shouldLog(ERROR);
    while (local_149 != false) {
      kj::_::Debug::log<char_const(&)[64]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x66,ERROR,
                 "\"failed: expected \" \"reader.getDataField<bool>(0 * ELEMENTS, false)\"",
                 (char (*) [64])"failed: expected reader.getDataField<bool>(0 * ELEMENTS, false)");
      local_149 = false;
    }
  }
  bVar1 = StructReader::getDataField<bool>((StructReader *)local_50,1,false);
  if (bVar1) {
    local_14a = kj::_::Debug::shouldLog(ERROR);
    while (local_14a != false) {
      kj::_::Debug::log<char_const(&)[67]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x67,ERROR,
                 "\"failed: expected \" \"!(reader.getDataField<bool>(1 * ELEMENTS, false))\"",
                 (char (*) [67])"failed: expected !(reader.getDataField<bool>(1 * ELEMENTS, false))"
                );
      local_14a = false;
    }
  }
  bVar1 = StructReader::getDataField<bool>((StructReader *)local_50,0x3f,false);
  if (!bVar1) {
    local_14b = kj::_::Debug::shouldLog(ERROR);
    while (local_14b != false) {
      kj::_::Debug::log<char_const(&)[65]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x68,ERROR,
                 "\"failed: expected \" \"reader.getDataField<bool>(63 * ELEMENTS, false)\"",
                 (char (*) [65])"failed: expected reader.getDataField<bool>(63 * ELEMENTS, false)");
      local_14b = false;
    }
  }
  bVar1 = StructReader::getDataField<bool>((StructReader *)local_50,0x40,false);
  if (bVar1) {
    local_14c = kj::_::Debug::shouldLog(ERROR);
    while (local_14c != false) {
      kj::_::Debug::log<char_const(&)[68]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x69,ERROR,
                 "\"failed: expected \" \"!(reader.getDataField<bool>(64 * ELEMENTS, false))\"",
                 (char (*) [68])
                 "failed: expected !(reader.getDataField<bool>(64 * ELEMENTS, false))");
      local_14c = false;
    }
  }
  bVar1 = StructReader::getDataField<bool>((StructReader *)local_50,0,true);
  if (bVar1) {
    local_14d = kj::_::Debug::shouldLog(ERROR);
    while (local_14d != false) {
      kj::_::Debug::log<char_const(&)[66]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x6a,ERROR,
                 "\"failed: expected \" \"!(reader.getDataField<bool>(0 * ELEMENTS, true))\"",
                 (char (*) [66])"failed: expected !(reader.getDataField<bool>(0 * ELEMENTS, true))")
      ;
      local_14d = false;
    }
  }
  bVar1 = StructReader::getDataField<bool>((StructReader *)local_50,1,true);
  if (!bVar1) {
    local_14e = kj::_::Debug::shouldLog(ERROR);
    while (local_14e != false) {
      kj::_::Debug::log<char_const(&)[63]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x6b,ERROR,
                 "\"failed: expected \" \"reader.getDataField<bool>(1 * ELEMENTS, true)\"",
                 (char (*) [63])"failed: expected reader.getDataField<bool>(1 * ELEMENTS, true)");
      local_14e = false;
    }
  }
  bVar1 = StructReader::getDataField<bool>((StructReader *)local_50,0x3f,true);
  if (bVar1) {
    local_14f = kj::_::Debug::shouldLog(ERROR);
    while (local_14f != false) {
      kj::_::Debug::log<char_const(&)[67]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x6c,ERROR,
                 "\"failed: expected \" \"!(reader.getDataField<bool>(63 * ELEMENTS, true))\"",
                 (char (*) [67])"failed: expected !(reader.getDataField<bool>(63 * ELEMENTS, true))"
                );
      local_14f = false;
    }
  }
  bVar1 = StructReader::getDataField<bool>((StructReader *)local_50,0x40,true);
  if (!bVar1) {
    local_150 = kj::_::Debug::shouldLog(ERROR);
    while (local_150 != false) {
      kj::_::Debug::log<char_const(&)[64]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x6d,ERROR,
                 "\"failed: expected \" \"reader.getDataField<bool>(64 * ELEMENTS, true)\"",
                 (char (*) [64])"failed: expected reader.getDataField<bool>(64 * ELEMENTS, true)");
      local_150 = false;
    }
  }
  return;
}

Assistant:

TEST(WireFormat, SimpleRawDataStruct) {
  AlignedData<2> data = {{
    // Struct ref, offset = 1, dataSize = 1, pointerCount = 0
    0x00, 0x00, 0x00, 0x00, 0x01, 0x00, 0x00, 0x00,
    // Content for the data section.
    0x01, 0x23, 0x45, 0x67, 0x89, 0xab, 0xcd, 0xef
  }};

  StructReader reader = PointerReader::getRootUnchecked(data.words).getStruct(nullptr);

  EXPECT_EQ(0xefcdab8967452301ull, reader.getDataField<uint64_t>(0 * ELEMENTS));
  EXPECT_EQ(0u, reader.getDataField<uint64_t>(1 * ELEMENTS));
  EXPECT_EQ(0x67452301u, reader.getDataField<uint32_t>(0 * ELEMENTS));
  EXPECT_EQ(0xefcdab89u, reader.getDataField<uint32_t>(1 * ELEMENTS));
  EXPECT_EQ(0u, reader.getDataField<uint32_t>(2 * ELEMENTS));
  EXPECT_EQ(0x2301u, reader.getDataField<uint16_t>(0 * ELEMENTS));
  EXPECT_EQ(0x6745u, reader.getDataField<uint16_t>(1 * ELEMENTS));
  EXPECT_EQ(0xab89u, reader.getDataField<uint16_t>(2 * ELEMENTS));
  EXPECT_EQ(0xefcdu, reader.getDataField<uint16_t>(3 * ELEMENTS));
  EXPECT_EQ(0u, reader.getDataField<uint16_t>(4 * ELEMENTS));

  EXPECT_EQ(321u ^ 0xefcdab8967452301ull, reader.getDataField<uint64_t>(0 * ELEMENTS, 321u));
  EXPECT_EQ(321u ^ 0x67452301u, reader.getDataField<uint32_t>(0 * ELEMENTS, 321u));
  EXPECT_EQ(321u ^ 0x2301u, reader.getDataField<uint16_t>(0 * ELEMENTS, 321u));
  EXPECT_EQ(321u, reader.getDataField<uint64_t>(1 * ELEMENTS, 321u));
  EXPECT_EQ(321u, reader.getDataField<uint32_t>(2 * ELEMENTS, 321u));
  EXPECT_EQ(321u, reader.getDataField<uint16_t>(4 * ELEMENTS, 321u));

  // Bits
  EXPECT_TRUE (reader.getDataField<bool>(0 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(1 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(2 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(3 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(4 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(5 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(6 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(7 * ELEMENTS));

  EXPECT_TRUE (reader.getDataField<bool>( 8 * ELEMENTS));
  EXPECT_TRUE (reader.getDataField<bool>( 9 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(10 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(11 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(12 * ELEMENTS));
  EXPECT_TRUE (reader.getDataField<bool>(13 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(14 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(15 * ELEMENTS));

  EXPECT_TRUE (reader.getDataField<bool>(63 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(64 * ELEMENTS));

  EXPECT_TRUE (reader.getDataField<bool>(0 * ELEMENTS, false));
  EXPECT_FALSE(reader.getDataField<bool>(1 * ELEMENTS, false));
  EXPECT_TRUE (reader.getDataField<bool>(63 * ELEMENTS, false));
  EXPECT_FALSE(reader.getDataField<bool>(64 * ELEMENTS, false));
  EXPECT_FALSE(reader.getDataField<bool>(0 * ELEMENTS, true));
  EXPECT_TRUE (reader.getDataField<bool>(1 * ELEMENTS, true));
  EXPECT_FALSE(reader.getDataField<bool>(63 * ELEMENTS, true));
  EXPECT_TRUE (reader.getDataField<bool>(64 * ELEMENTS, true));
}